

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::AsmJsByteCodeWriter::WasmMemAccess
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,uint32 offset,
          ViewType viewType)

{
  Data *this_00;
  bool bVar1;
  uint32 local_41;
  uint32 local_3d;
  RegSlot local_39;
  ViewType local_35;
  uint32 local_34;
  
  local_34 = offset;
  bVar1 = TryWriteWasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,value,slotIndex,offset,viewType);
  if (!bVar1) {
    bVar1 = TryWriteWasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,value,slotIndex,local_34,viewType);
    if (!bVar1) {
      local_41 = local_34;
      this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
      local_3d = slotIndex;
      local_39 = value;
      local_35 = viewType;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,&this->super_ByteCodeWriter,false)
      ;
      ByteCodeWriter::Data::Write(this_00,&local_41,0xd);
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::WasmMemAccess(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, uint32 offset, ArrayBufferView::ViewType viewType)
    {
        MULTISIZE_LAYOUT_WRITE(WasmMemAccess, op, value, slotIndex, offset, viewType);
    }